

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteTranslational::Update
          (ChLinkRevoluteTranslational *this,double time,bool update_assets)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  ChBodyFrame *pCVar16;
  ChBodyFrame *pCVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  ChVector<double> p2_abs;
  ChVector<double> p1_abs;
  ulong local_58;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  
  ChLink::UpdateTime(&this->super_ChLink,time);
  pCVar16 = (this->super_ChLink).Body1;
  ChTransform<double>::TransformLocalToParent
            (&this->m_p1,&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  pCVar16 = (this->super_ChLink).Body2;
  ChTransform<double>::TransformLocalToParent
            (&this->m_p2,&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  pCVar16 = (this->super_ChLink).Body2;
  dVar2 = (this->m_x2).m_data[1];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar2;
  dVar3 = (this->m_x2).m_data[0];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar3;
  dVar4 = (this->m_y2).m_data[1];
  pCVar17 = (this->super_ChLink).Body1;
  dVar5 = (this->m_z1).m_data[1];
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar5;
  dVar6 = (this->m_z1).m_data[0];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar6;
  dVar7 = (this->m_x2).m_data[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar7;
  dVar8 = (this->m_z1).m_data[2];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar8;
  dVar9 = *(double *)
           ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8
           );
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar9;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       dVar5 * *(double *)
                ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x20);
  auVar42 = vfmadd231sd_fma(auVar63,auVar67,auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       dVar5 * *(double *)
                ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 8);
  auVar43 = vfmadd231sd_fma(auVar69,auVar67,auVar43);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       dVar5 * *(double *)
                ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                        super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data + 0x38);
  auVar15 = vfmadd231sd_fma(auVar62,auVar67,auVar15);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar4;
  vmovsd_avx512f(auVar82);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar44 = vfmadd231sd_fma(auVar42,auVar70,auVar44);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar43 = vfmadd231sd_fma(auVar43,auVar70,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar15 = vfmadd231sd_fma(auVar15,auVar70,auVar19);
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar18 = vmulsd_avx512f(auVar23,auVar72);
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar19 = vmulsd_avx512f(auVar23,auVar78);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar4;
  auVar20 = vmulsd_avx512f(auVar22,auVar83);
  dVar4 = (this->m_y2).m_data[2];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar4;
  auVar21 = vmulsd_avx512f(auVar78,auVar83);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar9 * dVar2;
  auVar42 = vfmadd231sd_fma(auVar71,auVar25,auVar57);
  auVar18 = vfmadd231sd_fma(auVar18,auVar32,auVar57);
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar19 = vfmadd231sd_avx512f(auVar19,auVar73,auVar57);
  dVar9 = (this->m_y2).m_data[0];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar9;
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar22 = vfmadd231sd_avx512f(auVar18,auVar36,auVar74);
  auVar18 = vfmadd231sd_fma(auVar42,auVar36,auVar30);
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar23 = vfmadd231sd_avx512f(auVar19,auVar36,auVar79);
  auVar42 = vfmadd231sd_fma(auVar20,auVar58,auVar25);
  auVar19 = vmulsd_avx512f(auVar72,auVar83);
  auVar21 = vfmadd231sd_avx512f(auVar21,auVar58,auVar73);
  auVar20 = vmulsd_avx512f(auVar44,auVar22);
  auVar19 = vfmadd231sd_fma(auVar19,auVar58,auVar32);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_40;
  auVar24 = vfmadd231sd_avx512f(auVar20,auVar43,auVar18);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_28;
  auVar20 = vsubsd_avx512f(auVar35,auVar20);
  auVar42 = vfmadd231sd_fma(auVar42,auVar30,auVar26);
  auVar25 = vfmadd231sd_avx512f(auVar21,auVar79,auVar26);
  auVar19 = vfmadd231sd_avx512f(auVar19,auVar74,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_48;
  auVar26 = vfmadd231sd_avx512f(auVar24,auVar15,auVar23);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_30;
  auVar21 = vsubsd_avx512f(auVar27,auVar21);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_38;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_20;
  auVar24 = vsubsd_avx512f(auVar29,auVar24);
  auVar27 = vmulsd_avx512f(auVar44,auVar19);
  auVar28 = vmulsd_avx512f(auVar44,auVar20);
  auVar29 = vmulsd_avx512f(auVar22,auVar20);
  auVar27 = vfmadd231sd_avx512f(auVar27,auVar43,auVar42);
  auVar28 = vfmadd231sd_avx512f(auVar28,auVar21,auVar43);
  auVar29 = vfmadd231sd_avx512f(auVar29,auVar21,auVar18);
  auVar27 = vfmadd231sd_avx512f(auVar27,auVar15,auVar25);
  auVar29 = vfmadd231sd_avx512f(auVar29,auVar24,auVar23);
  auVar28 = vfmadd231sd_avx512f(auVar28,auVar24,auVar15);
  vmovsd_avx512f(auVar27);
  this->m_cur_par2 = this->m_cur_par2;
  vmovsd_avx512f(auVar28);
  this->m_cur_dot = this->m_cur_dot;
  vmovsd_avx512f(auVar26);
  this->m_cur_par1 = this->m_cur_par1;
  this->m_cur_dist = auVar29._0_8_;
  dVar10 = *(double *)
            ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x18);
  dVar11 = *(double *)
            ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x20);
  dVar12 = *(double *)
            ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            0x28);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar12;
  dVar13 = (pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar14 = *(double *)
            ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
            8);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar10;
  auVar30 = vmulsd_avx512f(auVar19,auVar75);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar11;
  auVar31 = vmulsd_avx512f(auVar19,auVar86);
  auVar32 = vmulsd_avx512f(auVar22,auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar10;
  auVar33 = vmulsd_avx512f(auVar20,auVar76);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar13;
  auVar30 = vfmadd231sd_avx512f(auVar30,auVar80,auVar42);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar14;
  auVar31 = vfmadd231sd_avx512f(auVar31,auVar84,auVar42);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar19._0_8_ * dVar12;
  auVar42 = vfmadd231sd_fma(auVar34,auVar48,auVar42);
  auVar19 = vmulsd_avx512f(auVar20,auVar86);
  auVar32 = vfmadd231sd_avx512f(auVar32,auVar80,auVar18);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar13;
  auVar33 = vfmadd231sd_avx512f(auVar33,auVar21,auVar81);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar11;
  auVar34 = vmulsd_avx512f(auVar22,auVar87);
  auVar34 = vfmadd231sd_avx512f(auVar34,auVar84,auVar18);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar14;
  auVar19 = vfmadd231sd_avx512f(auVar19,auVar21,auVar85);
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar35 = vmulsd_avx512f(auVar44,auVar77);
  auVar36 = vmulsd_avx512f(auVar20,auVar77);
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar35 = vfmadd231sd_avx512f(auVar35,auVar88,auVar43);
  auVar36 = vfmadd231sd_avx512f(auVar36,auVar21,auVar88);
  auVar89._8_8_ = 0;
  auVar89._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x20
        );
  auVar37 = vmulsd_avx512f(auVar44,auVar89);
  auVar38 = vmulsd_avx512f(auVar20,auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8);
  auVar37 = vfmadd231sd_avx512f(auVar37,auVar90,auVar43);
  auVar38 = vfmadd231sd_avx512f(auVar38,auVar21,auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar39 = vmulsd_avx512f(auVar44,auVar91);
  auVar40 = vmulsd_avx512f(auVar20,auVar91);
  auVar20 = vmulsd_avx512f(auVar20,auVar59);
  auVar39 = vfmadd231sd_avx512f(auVar39,auVar41,auVar43);
  auVar40 = vfmadd231sd_avx512f(auVar40,auVar41,auVar21);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar20 = vfmadd231sd_avx512f(auVar20,auVar21,auVar48);
  auVar21 = vmulsd_avx512f(auVar22,auVar59);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar21 = vfmadd231sd_avx512f(auVar21,auVar48,auVar18);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       *(double *)
        ((long)&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar30 = vfmadd231sd_avx512f(auVar30,auVar45,auVar25);
  auVar32 = vfmadd231sd_avx512f(auVar32,auVar45,auVar23);
  auVar33 = vfmadd231sd_avx512f(auVar33,auVar24,auVar45);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x30
        );
  auVar41 = vfmadd231sd_avx512f(auVar21,auVar60,auVar23);
  auVar21 = vfmadd231sd_avx512f(auVar42,auVar60,auVar25);
  auVar20 = vfmadd231sd_avx512f(auVar20,auVar24,auVar60);
  auVar34 = vfmadd231sd_avx512f(auVar34,auVar49,auVar23);
  auVar25 = vfmadd231sd_avx512f(auVar31,auVar49,auVar25);
  auVar31 = vfmadd231sd_avx512f(auVar19,auVar24,auVar49);
  auVar35 = vfmadd231sd_avx512f(auVar35,auVar46,auVar15);
  auVar19 = vfmadd231sd_avx512f(auVar36,auVar24,auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x38
        );
  auVar36 = vfmadd231sd_avx512f(auVar37,auVar47,auVar15);
  auVar37 = vfmadd231sd_avx512f(auVar38,auVar24,auVar47);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       *(double *)
        ((long)&(pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  vmovsd_avx512f(auVar26);
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
       = (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
         array[0];
  (this->m_cnstr_par1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_par1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_par1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  auVar24 = vfmadd231sd_avx512f(auVar40,auVar38,auVar24);
  auVar26 = vfmadd231sd_avx512f(auVar39,auVar38,auVar15);
  auVar42 = vmulsd_avx512f(auVar34,auVar70);
  auVar42 = vfmsub231sd_avx512f(auVar42,auVar64,auVar41);
  (this->m_cnstr_par1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar42._0_8_;
  auVar42 = vmulsd_avx512f(auVar41,auVar67);
  auVar42 = vfmsub231sd_avx512f(auVar42,auVar70,auVar32);
  (this->m_cnstr_par1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar42._0_8_;
  auVar42 = vmulsd_avx512f(auVar32,auVar64);
  auVar42 = vfmsub231sd_avx512f(auVar42,auVar67,auVar34);
  (this->m_cnstr_par1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar42._0_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar7;
  auVar42 = vmulsd_avx512f(auVar36,auVar96);
  (this->m_cnstr_par1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_par1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_par1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar2;
  auVar42 = vfmsub231sd_avx512f(auVar42,auVar94,auVar26);
  (this->m_cnstr_par1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar42._0_8_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar3;
  auVar42 = vmulsd_avx512f(auVar26,auVar92);
  auVar42 = vfmsub231sd_avx512f(auVar42,auVar96,auVar35);
  (this->m_cnstr_par1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar42._0_8_;
  auVar42 = vmulsd_avx512f(auVar35,auVar94);
  auVar42 = vfmsub231sd_avx512f(auVar42,auVar92,auVar36);
  (this->m_cnstr_par1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar42._0_8_;
  pdVar1 = (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
           .array + 1;
  vmovsd_avx512f(auVar27);
  *pdVar1 = *pdVar1;
  (this->m_cnstr_par2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_par2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_par2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar3;
  auVar27 = vmulsd_avx512f(auVar24,auVar93);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar8 * auVar25._0_8_;
  auVar42 = vfmsub231sd_fma(auVar39,auVar64,auVar21);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar7;
  auVar27 = vfmsub231sd_avx512f(auVar27,auVar97,auVar19);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar2;
  auVar38 = vmulsd_avx512f(auVar19,auVar95);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar6 * auVar21._0_8_;
  auVar19 = vfmsub231sd_fma(auVar40,auVar70,auVar30);
  auVar38 = vfmsub231sd_avx512f(auVar38,auVar93,auVar37);
  (this->m_cnstr_par2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar42._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar5 * auVar30._0_8_;
  auVar42 = vfmsub231sd_fma(auVar53,auVar67,auVar25);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_58;
  (this->m_cnstr_par2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar19._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar4;
  (this->m_cnstr_par2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar42._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar9;
  (this->m_cnstr_par2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_cnstr_par2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_cnstr_par2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = 0.0;
  auVar42 = vmulsd_avx512f(auVar20,auVar67);
  auVar25 = vfmsub231sd_avx512f(auVar42,auVar70,auVar33);
  auVar42 = vmulsd_avx512f(auVar26,auVar54);
  auVar42 = vfmsub231sd_avx512f(auVar42,auVar35,auVar50);
  auVar19 = vmulsd_avx512f(auVar36,auVar50);
  auVar19 = vfmsub231sd_avx512f(auVar19,auVar51,auVar26);
  auVar21 = vmulsd_avx512f(auVar35,auVar51);
  auVar21 = vfmsub231sd_avx512f(auVar21,auVar36,auVar54);
  (this->m_cnstr_par2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar19._0_8_;
  (this->m_cnstr_par2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar42._0_8_;
  auVar42 = vmulsd_avx512f(auVar33,auVar64);
  (this->m_cnstr_par2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar21._0_8_;
  pdVar1 = (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
           .array + 2;
  vmovsd_avx512f(auVar28);
  *pdVar1 = *pdVar1;
  auVar19 = vfmsub231sd_fma(auVar42,auVar67,auVar31);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar8 * auVar31._0_8_;
  auVar28 = vfmsub231sd_avx512f(auVar28,auVar64,auVar20);
  auVar42 = vmulsd_avx512f(auVar37,auVar97);
  dVar2 = (this->m_p1).m_data[2];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar2;
  dVar3 = (this->m_p1).m_data[1];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar3;
  dVar4 = (this->m_p1).m_data[0];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar4;
  auVar30 = vfmsub231sd_avx512f(auVar42,auVar95,auVar24);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar5 * dVar2;
  auVar20 = vfmsub231sd_fma(auVar55,auVar33,auVar70);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar8 * dVar4;
  auVar21 = vfmsub231sd_fma(auVar31,auVar37,auVar67);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar6 * dVar3;
  auVar24 = vfmsub231sd_fma(auVar68,auVar61,auVar64);
  auVar42 = vunpcklpd_avx(auVar43,auVar44);
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = -auVar42._0_8_;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = -auVar42._8_8_;
  auVar65._0_8_ = -auVar15._0_8_;
  auVar65._8_8_ = auVar15._8_8_ ^ 0x8000000000000000;
  dVar2 = (double)vmovlpd_avx(auVar65);
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = dVar2;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar28._0_8_ - auVar20._0_8_;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar25._0_8_ - auVar21._0_8_;
  (this->m_cnstr_dot).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar19._0_8_ - auVar24._0_8_;
  auVar42 = vmulsd_avx512f(auVar41,auVar61);
  auVar19 = vmulsd_avx512f(auVar34,auVar37);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = (this->m_p2).m_data[0];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = (this->m_p2).m_data[2];
  auVar20 = vfmsub231sd_avx512f(auVar42,auVar32,auVar37);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = (this->m_p2).m_data[1];
  auVar42 = vfmsub231sd_avx512f(auVar19,auVar33,auVar41);
  auVar19 = vmulsd_avx512f(auVar32,auVar33);
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = auVar43._0_8_;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = auVar44._0_8_;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = auVar15._0_8_;
  auVar43 = vfmsub231sd_avx512f(auVar19,auVar61,auVar34);
  auVar42 = vunpcklpd_avx(auVar23,auVar42);
  auVar44 = vmulsd_avx512f(auVar36,auVar56);
  auVar19 = vmulsd_avx512f(auVar26,auVar66);
  auVar21 = vmulsd_avx512f(auVar97,auVar66);
  auVar24 = vmulsd_avx512f(auVar95,auVar56);
  auVar43 = vunpcklpd_avx(auVar20,auVar43);
  auVar15 = vunpcklpd_avx(auVar18,auVar22);
  auVar20 = vmulsd_avx512f(auVar35,auVar52);
  auVar44 = vfmsub231sd_avx512f(auVar44,auVar52,auVar26);
  auVar19 = vfmsub231sd_avx512f(auVar19,auVar56,auVar35);
  auVar21 = vfmsub231sd_avx512f(auVar21,auVar93,auVar56);
  auVar24 = vfmsub231sd_avx512f(auVar24,auVar52,auVar97);
  auVar25 = vmulsd_avx512f(auVar93,auVar52);
  auVar20 = vfmsub231sd_avx512f(auVar20,auVar66,auVar36);
  auVar25 = vfmsub231sd_avx512f(auVar25,auVar66,auVar95);
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar44._0_8_;
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar19._0_8_;
  auVar44 = vaddsd_avx512f(auVar30,auVar24);
  (this->m_cnstr_dot).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar20._0_8_;
  auVar19 = vaddsd_avx512f(auVar38,auVar25);
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
       = auVar29._0_8_ - this->m_dist;
  (this->m_cnstr_dist).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = -auVar15._0_8_;
  (this->m_cnstr_dist).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = -auVar15._8_8_;
  (this->m_cnstr_dist).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = -auVar42._0_8_;
  (this->m_cnstr_dist).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = -auVar42._8_8_;
  auVar42 = vaddsd_avx512f(auVar27,auVar21);
  (this->m_cnstr_dist).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = -auVar43._0_8_;
  (this->m_cnstr_dist).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = -auVar43._8_8_;
  (this->m_cnstr_dist).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[0] = auVar18._0_8_;
  (this->m_cnstr_dist).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[1] = auVar22._0_8_;
  (this->m_cnstr_dist).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[2] = auVar23._0_8_;
  (this->m_cnstr_dist).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[3] = auVar44._0_8_;
  (this->m_cnstr_dist).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[4] = auVar42._0_8_;
  (this->m_cnstr_dist).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
  m_data.array[5] = auVar19._0_8_;
  return;
}

Assistant:

void ChLinkRevoluteTranslational::Update(double time, bool update_assets) {
    // Inherit time changes of parent class (ChLink)
    ChLink::UpdateTime(time);

    // Express the body locations and direction in absolute frame
    ChVector<> p1_abs = Body1->TransformPointLocalToParent(m_p1);
    ChVector<> p2_abs = Body2->TransformPointLocalToParent(m_p2);
    ChVector<> z1_abs = Body1->TransformDirectionLocalToParent(m_z1);
    ChVector<> x2_abs = Body2->TransformDirectionLocalToParent(m_x2);
    ChVector<> y2_abs = Body2->TransformDirectionLocalToParent(m_y2);
    ChVector<> d12_abs = p2_abs - p1_abs;

    // Update current constraint quantities
    m_cur_par1 = Vdot(z1_abs, x2_abs);
    m_cur_par2 = Vdot(z1_abs, y2_abs);
    m_cur_dot = Vdot(d12_abs, z1_abs);
    m_cur_dist = Vdot(d12_abs, x2_abs);

    // Calculate a few more quantities
    // (express directions on one body in the frame ot the other body)
    ChVector<> z1_2 = Body2->TransformDirectionParentToLocal(z1_abs);
    ChVector<> x2_1 = Body1->TransformDirectionParentToLocal(x2_abs);
    ChVector<> y2_1 = Body1->TransformDirectionParentToLocal(y2_abs);

    ChVector<> d12_1 = Body1->TransformDirectionParentToLocal(d12_abs);
    ChVector<> d12_2 = Body2->TransformDirectionParentToLocal(d12_abs);

    // First constraint (par1)
    {
        // Cache constraint violation
        m_C(0) = m_cur_par1;

        // Set Jacobian w.r.t. states of Body 1
        ChVector<> Phi_pi1 = Vcross(m_z1, x2_1);

        m_cnstr_par1.Get_Cq_a()(0) = 0;
        m_cnstr_par1.Get_Cq_a()(1) = 0;
        m_cnstr_par1.Get_Cq_a()(2) = 0;

        m_cnstr_par1.Get_Cq_a()(3) = Phi_pi1.x();
        m_cnstr_par1.Get_Cq_a()(4) = Phi_pi1.y();
        m_cnstr_par1.Get_Cq_a()(5) = Phi_pi1.z();

        // Set Jacobian w.r.t. states of Body 2
        ChVector<> Phi_pi2 = Vcross(m_x2, z1_2);

        m_cnstr_par1.Get_Cq_b()(0) = 0;
        m_cnstr_par1.Get_Cq_b()(1) = 0;
        m_cnstr_par1.Get_Cq_b()(2) = 0;

        m_cnstr_par1.Get_Cq_b()(3) = Phi_pi2.x();
        m_cnstr_par1.Get_Cq_b()(4) = Phi_pi2.y();
        m_cnstr_par1.Get_Cq_b()(5) = Phi_pi2.z();
    }

    // Second constraint (par2)
    {
        // Cache constraint violation
        m_C(1) = m_cur_par2;

        // Set Jacobian w.r.t. states of Body 1
        ChVector<> Phi_pi1 = Vcross(m_z1, y2_1);

        m_cnstr_par2.Get_Cq_a()(0) = 0;
        m_cnstr_par2.Get_Cq_a()(1) = 0;
        m_cnstr_par2.Get_Cq_a()(2) = 0;

        m_cnstr_par2.Get_Cq_a()(3) = Phi_pi1.x();
        m_cnstr_par2.Get_Cq_a()(4) = Phi_pi1.y();
        m_cnstr_par2.Get_Cq_a()(5) = Phi_pi1.z();

        // Set Jacobian w.r.t. states of Body 2
        ChVector<> Phi_pi2 = Vcross(m_y2, z1_2);

        m_cnstr_par2.Get_Cq_b()(0) = 0;
        m_cnstr_par2.Get_Cq_b()(1) = 0;
        m_cnstr_par2.Get_Cq_b()(2) = 0;

        m_cnstr_par2.Get_Cq_b()(3) = Phi_pi2.x();
        m_cnstr_par2.Get_Cq_b()(4) = Phi_pi2.y();
        m_cnstr_par2.Get_Cq_b()(5) = Phi_pi2.z();
    }

    // Third constraint (dot)
    {
        // Cache constraint violation
        m_C(2) = m_cur_dot;

        // Set Jacobian w.r.t. states of Body 1
        ChVector<> Phi_pi1 = Vcross(m_z1, d12_1) - Vcross(m_p1, m_z1);

        m_cnstr_dot.Get_Cq_a()(0) = -z1_abs.x();
        m_cnstr_dot.Get_Cq_a()(1) = -z1_abs.y();
        m_cnstr_dot.Get_Cq_a()(2) = -z1_abs.z();

        m_cnstr_dot.Get_Cq_a()(3) = Phi_pi1.x();
        m_cnstr_dot.Get_Cq_a()(4) = Phi_pi1.y();
        m_cnstr_dot.Get_Cq_a()(5) = Phi_pi1.z();

        // Set Jacobian w.r.t. states of Body 2
        ChVector<> Phi_pi2 = Vcross(m_p2, z1_2);

        m_cnstr_dot.Get_Cq_b()(0) = z1_abs.x();
        m_cnstr_dot.Get_Cq_b()(1) = z1_abs.y();
        m_cnstr_dot.Get_Cq_b()(2) = z1_abs.z();

        m_cnstr_dot.Get_Cq_b()(3) = Phi_pi2.x();
        m_cnstr_dot.Get_Cq_b()(4) = Phi_pi2.y();
        m_cnstr_dot.Get_Cq_b()(5) = Phi_pi2.z();
    }

    // Fourth constraint (dist)
    {
        // Cache constraint violation
        m_C(3) = m_cur_dist - m_dist;

        // Set Jacobian w.r.t. states of Body 1
        ChVector<> Phi_pi1 = -Vcross(m_p1, x2_1);

        m_cnstr_dist.Get_Cq_a()(0) = -x2_abs.x();
        m_cnstr_dist.Get_Cq_a()(1) = -x2_abs.y();
        m_cnstr_dist.Get_Cq_a()(2) = -x2_abs.z();

        m_cnstr_dist.Get_Cq_a()(3) = Phi_pi1.x();
        m_cnstr_dist.Get_Cq_a()(4) = Phi_pi1.y();
        m_cnstr_dist.Get_Cq_a()(5) = Phi_pi1.z();

        // Set Jacobian w.r.t. states of Body 2
        ChVector<> Phi_pi2 = Vcross(m_x2, d12_2) + Vcross(m_p2, m_x2);

        m_cnstr_dist.Get_Cq_b()(0) = x2_abs.x();
        m_cnstr_dist.Get_Cq_b()(1) = x2_abs.y();
        m_cnstr_dist.Get_Cq_b()(2) = x2_abs.z();

        m_cnstr_dist.Get_Cq_b()(3) = Phi_pi2.x();
        m_cnstr_dist.Get_Cq_b()(4) = Phi_pi2.y();
        m_cnstr_dist.Get_Cq_b()(5) = Phi_pi2.z();
    }
}